

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O2

RealType __thiscall OpenMD::Snapshot::getSelfPotential(Snapshot *this)

{
  int i;
  long lVar1;
  RealType RVar2;
  
  if (this->hasSelfPotential == true) {
    return (this->frameData).selfPotential;
  }
  RVar2 = 0.0;
  for (lVar1 = 0; lVar1 != 7; lVar1 = lVar1 + 1) {
    RVar2 = RVar2 + (this->frameData).selfPotentials.data_[lVar1];
  }
  (this->frameData).selfPotential = RVar2;
  this->hasSelfPotential = true;
  this->hasPotentialEnergy = false;
  this->hasTotalEnergy = false;
  return RVar2;
}

Assistant:

RealType Snapshot::getSelfPotential() {
    if (!hasSelfPotential) {
      frameData.selfPotential = 0.0;
      for (int i = 0; i < N_INTERACTION_FAMILIES; i++) {
        frameData.selfPotential += frameData.selfPotentials[i];
      }
      hasSelfPotential   = true;
      hasPotentialEnergy = false;
      hasTotalEnergy     = false;
    }
    return frameData.selfPotential;
  }